

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmsh_reader.cc
# Opt level: O0

variant<lf::io::GMshFileV2,_lf::io::GMshFileV4> *
lf::io::ReadGmshFile
          (variant<lf::io::GMshFileV2,_lf::io::GMshFileV4> *__return_storage_ptr__,string *filename)

{
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_int,_int>
  *ptVar1;
  __tuple_element_t<1UL,_tuple<basic_string<char,_char_traits<char>,_allocator<char>_>,_bool,_int,_int>_>
  _Var2;
  int iVar3;
  byte bVar4;
  bool bVar5;
  _Ios_Openmode _Var6;
  LfException *this;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __result;
  const_iterator last;
  ostream *poVar7;
  runtime_error *prVar8;
  __tuple_element_t<0UL,_tuple<basic_string<char,_char_traits<char>,_allocator<char>_>,_bool,_int,_int>_>
  *p_Var9;
  __tuple_element_t<1UL,_tuple<basic_string<char,_char_traits<char>,_allocator<char>_>,_bool,_int,_int>_>
  *p_Var10;
  __tuple_element_t<2UL,_tuple<basic_string<char,_char_traits<char>,_allocator<char>_>,_bool,_int,_int>_>
  *p_Var11;
  __tuple_element_t<3UL,_tuple<basic_string<char,_char_traits<char>,_allocator<char>_>,_bool,_int,_int>_>
  *p_Var12;
  string local_1330;
  allocator<char> local_1309;
  string local_1308;
  allocator<char> local_12e1;
  string local_12e0;
  stringstream local_12c0 [8];
  stringstream ss_1;
  ostream local_12b0 [376];
  const_iterator local_1138;
  const_iterator local_1130;
  GMshFileV2 local_1128;
  undefined4 local_109c;
  const_iterator local_1098;
  const_iterator local_1090;
  GMshFileV4 local_1088;
  string local_ed8;
  allocator<char> local_eb1;
  string local_eb0;
  allocator<char> local_e89;
  string local_e88;
  stringstream local_e68 [8];
  stringstream ss;
  ostream local_e58 [376];
  char *local_ce0;
  undefined1 local_cd1;
  undefined1 local_cd0 [7];
  bool succesful;
  bool_<false> local_cbe;
  terminal<boost::spirit::tag::attr> local_cbd [2];
  bool_<false> local_cbb;
  terminal<boost::spirit::tag::lit> local_cba [2];
  expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<char>_>_>,_0L>_&>,_2L>
  local_cb8;
  expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<char>_>_>,_0L>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::attr,_boost::fusion::vector<bool>_>_>,_0L>_&>,_2L>
  local_ca8;
  expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<char>_>_>,_0L>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::attr,_boost::fusion::vector<bool>_>_>,_0L>_&>,_2L>_&,_const_boost::spirit::terminal<boost::spirit::tag::int_>_&>,_2L>
  local_c98;
  expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<char>_>_>,_0L>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::attr,_boost::fusion::vector<bool>_>_>,_0L>_&>,_2L>_&,_const_boost::spirit::terminal<boost::spirit::tag::int_>_&>,_2L>_&,_const_boost::spirit::terminal<boost::spirit::tag::little_dword>_&>,_2L>
  local_c88;
  undefined4 local_c74;
  terminal<boost::spirit::tag::attr> local_c70 [10];
  bool_<false> local_c66;
  terminal<boost::spirit::tag::attr> local_c65 [2];
  bool_<false> local_c63;
  terminal<boost::spirit::tag::lit> local_c62 [2];
  undefined1 *local_c60;
  terminal<boost::spirit::tag::lit> *local_c58;
  expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<char>_>_>,_0L>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::attr,_boost::fusion::vector<bool>_>_>,_0L>_&>,_2L>
  local_c50;
  expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<char>_>_>,_0L>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::attr,_boost::fusion::vector<bool>_>_>,_0L>_&>,_2L>_&,_const_boost::spirit::terminal<boost::spirit::tag::int_>_&>,_2L>
  local_c40;
  expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<char>_>_>,_0L>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::attr,_boost::fusion::vector<bool>_>_>,_0L>_&>,_2L>_&,_const_boost::spirit::terminal<boost::spirit::tag::int_>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::attr,_boost::fusion::vector<int>_>_>,_0L>_&>,_2L>
  local_c30;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::hold>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<char>_>_>,_0L>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::attr,_boost::fusion::vector<bool>_>_>,_0L>_&>,_2L>_&,_const_boost::spirit::terminal<boost::spirit::tag::int_>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::attr,_boost::fusion::vector<int>_>_>,_0L>_&>,_2L>_&>,_2L>
  local_c20;
  expr<_4f331b01_> local_c10;
  type local_c00;
  expr<_6e9f24a4_> local_bf0;
  expr<_e9e51382_> local_be0;
  allocator<char> local_bc9;
  string local_bc8;
  undefined1 local_ba8 [8];
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_int,_int>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
  header_parser;
  expr<boost::proto::tagns_::tag::unary_plus,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::alnum,_boost::spirit::char_encoding::ascii>_>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::punct,_boost::spirit::char_encoding::ascii>_>,_0L>_&>,_2L>_&>,_1L>
  local_b50;
  allocator<char> local_b41;
  string local_b40;
  undefined1 local_b20 [8];
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  version_parser;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_int,_int>
  header;
  const_iterator end;
  const_iterator iter;
  istream_iterator<char,_char,_std::char_traits<char>,_long> local_a88;
  istream_iterator<char,_char,_std::char_traits<char>,_long> local_a78;
  undefined1 local_a68 [8];
  string storage;
  string local_a40;
  allocator<char> local_a19;
  undefined1 local_a18 [8];
  string error;
  long local_9e8;
  ifstream in;
  string *filename_local;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::hold>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<char>_>_>,_0L>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::attr,_boost::fusion::vector<bool>_>_>,_0L>_&>,_2L>_&,_const_boost::spirit::terminal<boost::spirit::tag::int_>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::attr,_boost::fusion::vector<int>_>_>,_0L>_&>,_2L>_&>,_2L>
  that_6;
  expr_type that;
  expr_type that_1;
  expr_type that_2;
  expr_type that_7;
  expr_type that_3;
  expr_type that_8;
  expr_type that_4;
  expr_type that_9;
  expr_type that_5;
  undefined1 local_1e1;
  expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<char>_>_>,_0L>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::attr,_boost::fusion::vector<bool>_>_>,_0L>_&>,_2L>_&,_const_boost::spirit::terminal<boost::spirit::tag::int_>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::attr,_boost::fusion::vector<int>_>_>,_0L>_&>,_2L>
  *local_1e0;
  expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<char>_>_>,_0L>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::attr,_boost::fusion::vector<bool>_>_>,_0L>_&>,_2L>_&,_const_boost::spirit::terminal<boost::spirit::tag::int_>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::attr,_boost::fusion::vector<int>_>_>,_0L>_&>,_2L>
  *local_1d8;
  undefined1 *local_1d0;
  expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<char>_>_>,_0L>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::attr,_boost::fusion::vector<bool>_>_>,_0L>_&>,_2L>_&,_const_boost::spirit::terminal<boost::spirit::tag::int_>_&>,_2L>
  *peStack_1c0;
  expr_type that_10;
  expr_type that_11;
  expr_type that_12;
  expr_type that_13;
  
  _Var6 = std::operator|(_S_in,_S_bin);
  std::ifstream::ifstream(&local_9e8,(string *)filename,_Var6);
  bVar4 = std::ios::operator!((ios *)((long)&local_9e8 + *(long *)(local_9e8 + -0x18)));
  if ((bVar4 & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_a18,"Could not open file ",&local_a19);
    std::allocator<char>::~allocator(&local_a19);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a18,
               filename);
    storage.field_2._M_local_buf[0xf] = '\x01';
    this = (LfException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string
              ((string *)&local_a40,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a18);
    lf::base::LfException::LfException(this,&local_a40);
    storage.field_2._M_local_buf[0xf] = '\0';
    __cxa_throw(this,&lf::base::LfException::typeinfo,lf::base::LfException::~LfException);
  }
  std::__cxx11::string::string((string *)local_a68);
  std::ios_base::unsetf((ios_base *)((long)&local_9e8 + *(long *)(local_9e8 + -0x18)),_S_skipws);
  std::istream_iterator<char,_char,_std::char_traits<char>,_long>::istream_iterator
            (&local_a78,(istream_type *)&local_9e8);
  std::istream_iterator<char,_char,_std::char_traits<char>,_long>::istream_iterator(&local_a88);
  __result = std::back_inserter<std::__cxx11::string>
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_a68);
  std::
  copy<std::istream_iterator<char,char,std::char_traits<char>,long>,std::back_insert_iterator<std::__cxx11::string>>
            (&local_a78,&local_a88,__result);
  end = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::cbegin
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a68);
  last = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::cend
                   ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a68);
  std::
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_int,_int>
  ::tuple<void,_true>((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_int,_int>
                       *)((long)&version_parser.f.
                                 super_function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::unused_type_&>
                                 .super_function_base.functor + 0x10));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b40,"unnamed-rule",&local_b41)
  ;
  boost::spirit::qi::
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule((rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
          *)local_b20,&local_b40);
  std::__cxx11::string::~string((string *)&local_b40);
  std::allocator<char>::~allocator(&local_b41);
  header_parser.f.
  super_function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_int,_int>_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
  .super_function_base.functor._16_8_ = &boost::spirit::ascii::alnum;
  local_b50.child0 =
       (proto_child0)
       ((long)&header_parser.f.
               super_function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_int,_int>_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
               .super_function_base.functor + 0x10);
  boost::spirit::qi::operator%=
            ((rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
              *)local_b20,&local_b50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_bc8,"unnamed-rule",&local_bc9)
  ;
  boost::spirit::qi::
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_int,_int>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule((rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_int,_int>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
          *)local_ba8,&local_bc8);
  std::__cxx11::string::~string((string *)&local_bc8);
  std::allocator<char>::~allocator(&local_bc9);
  boost::spirit::terminal<boost::spirit::tag::lit>::operator()
            (&local_c00,(terminal<boost::spirit::tag::lit> *)&boost::spirit::lit,
             (char (*) [12])"$MeshFormat",(is_false)0x0);
  local_c63 = (bool_<false>)0x30;
  boost::spirit::terminal<boost::spirit::tag::lit>::operator()
            (local_c62,&boost::spirit::lit,&local_c63);
  local_c60 = local_b20;
  local_c58 = local_c62;
  local_c66 = (bool_<false>)0x0;
  boost::spirit::terminal<boost::spirit::tag::attr>::operator()
            (local_c65,(bool *)&boost::spirit::attr,&local_c66);
  local_c50.child0 = (proto_child0)&local_c60;
  local_c50.child1 = (proto_child1)local_c65;
  local_c40.child0 = &local_c50;
  local_c40.child1 = (proto_child1)&boost::spirit::int_;
  local_c74 = 1;
  boost::spirit::terminal<boost::spirit::tag::attr>::operator()
            (local_c70,(int *)&boost::spirit::attr,(is_false)&local_c74);
  local_c30.child0 = &local_c40;
  local_c30.child1 = (proto_child1)local_c70;
  local_c20.child1 = &local_c30;
  local_1d0 = &local_1e1;
  local_c20.child0 = (proto_child0)&boost::spirit::hold;
  local_cbb = (bool_<false>)0x31;
  local_1e0 = local_c20.child1;
  local_1d8 = local_c20.child1;
  boost::spirit::terminal<boost::spirit::tag::lit>::operator()
            (local_cba,&boost::spirit::lit,&local_cbb);
  local_cb8.child0 = (proto_child0)local_b20;
  local_cb8.child1 = (proto_child1)local_cba;
  local_cbe = (bool_<false>)0x1;
  boost::spirit::terminal<boost::spirit::tag::attr>::operator()
            (local_cbd,(bool *)&boost::spirit::attr,&local_cbe);
  local_ca8.child0 = &local_cb8;
  local_ca8.child1 = (proto_child1)local_cbd;
  local_c98.child0 = &local_ca8;
  local_c98.child1 = (proto_child1)&boost::spirit::int_;
  local_c88.child0 = &local_c98;
  that_10.child1 = (proto_child1)&boost::spirit::little_dword;
  that_10.child0 = (proto_child0)&boost::spirit::little_dword;
  local_c88.child1 = (proto_child1)&boost::spirit::little_dword;
  local_c10.child0 = &local_c20;
  local_c10.child1 = &local_c88;
  local_bf0.child0 = &local_c00;
  local_bf0.child1 = &local_c10;
  peStack_1c0 = local_c88.child0;
  boost::spirit::terminal<boost::spirit::tag::lit>::operator()
            ((type *)local_cd0,(terminal<boost::spirit::tag::lit> *)&boost::spirit::lit,
             (char (*) [15])"$EndMeshFormat",(is_false)0x0);
  local_be0.child0 = &local_bf0;
  local_be0.child1 = (proto_child1)local_cd0;
  boost::spirit::qi::operator%=
            ((rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_int,_int>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
              *)local_ba8,&local_be0);
  local_ce0 = last._M_current;
  local_cd1 = boost::spirit::qi::
              phrase_parse<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::tuple<std::__cxx11::string,bool,int,int>(),boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,boost::spirit::char_encoding::ascii>>,0l>,boost::spirit::unused_type,boost::spirit::unused_type>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,boost::spirit::char_encoding::ascii>>,0l>,std::tuple<std::__cxx11::string,bool,int,int>>
                        (&end,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               )last._M_current,
                         (rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_int,_int>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
                          *)local_ba8,
                         (expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>
                          *)&boost::spirit::ascii::space,
                         (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_int,_int>
                          *)((long)&version_parser.f.
                                    super_function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::unused_type_&>
                                    .super_function_base.functor + 0x10));
  if (!(bool)local_cd1) {
    std::__cxx11::stringstream::stringstream(local_e68);
    poVar7 = std::operator<<(local_e58,"Could not read header of file ");
    std::operator<<(poVar7,(string *)filename);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_e88,"succesful",&local_e89);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_eb0,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/io/gmsh_reader.cc"
               ,&local_eb1);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_e88,&local_eb0,0x2ad,&local_ed8);
    std::__cxx11::string::~string((string *)&local_ed8);
    std::__cxx11::string::~string((string *)&local_eb0);
    std::allocator<char>::~allocator(&local_eb1);
    std::__cxx11::string::~string((string *)&local_e88);
    std::allocator<char>::~allocator(&local_e89);
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar8,"this code should not be reached");
    __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  p_Var9 = std::get<0ul,std::__cxx11::string,bool,int,int>
                     ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_int,_int>
                       *)((long)&version_parser.f.
                                 super_function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::unused_type_&>
                                 .super_function_base.functor + 0x10));
  bVar5 = std::operator==(p_Var9,"4.1");
  if (bVar5) {
    local_1090._M_current = end._M_current;
    ptVar1 = (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_int,_int>
              *)((long)&version_parser.f.
                        super_function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::unused_type_&>
                        .super_function_base.functor.members + 0x10);
    local_1098 = last;
    p_Var9 = std::get<0ul,std::__cxx11::string,bool,int,int>(ptVar1);
    p_Var10 = std::get<1ul,std::__cxx11::string,bool,int,int>(ptVar1);
    _Var2 = *p_Var10;
    p_Var11 = std::get<2ul,std::__cxx11::string,bool,int,int>(ptVar1);
    iVar3 = *p_Var11;
    p_Var12 = std::get<3ul,std::__cxx11::string,bool,int,int>(ptVar1);
    ReadGmshFileV4(&local_1088,local_1090,local_1098,p_Var9,(bool)(_Var2 & 1),iVar3,*p_Var12,
                   filename);
    std::variant<lf::io::GMshFileV2,lf::io::GMshFileV4>::
    variant<lf::io::GMshFileV4,void,void,lf::io::GMshFileV4,void>
              ((variant<lf::io::GMshFileV2,lf::io::GMshFileV4> *)__return_storage_ptr__,&local_1088)
    ;
    GMshFileV4::~GMshFileV4(&local_1088);
  }
  else {
    p_Var9 = std::get<0ul,std::__cxx11::string,bool,int,int>
                       ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_int,_int>
                         *)((long)&version_parser.f.
                                   super_function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::unused_type_&>
                                   .super_function_base.functor + 0x10));
    bVar5 = std::operator==(p_Var9,"2.2");
    if (!bVar5) {
      std::__cxx11::stringstream::stringstream(local_12c0);
      poVar7 = std::operator<<(local_12b0,"GmshFiles with Version ");
      p_Var9 = std::get<0ul,std::__cxx11::string,bool,int,int>
                         ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_int,_int>
                           *)((long)&version_parser.f.
                                     super_function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::unused_type_&>
                                     .super_function_base.functor + 0x10));
      poVar7 = std::operator<<(poVar7,(string *)p_Var9);
      std::operator<<(poVar7," are not yet supported.");
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_12e0,"false",&local_12e1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1308,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/io/gmsh_reader.cc"
                 ,&local_1309);
      std::__cxx11::stringstream::str();
      lf::base::AssertionFailed(&local_12e0,&local_1308,0x2b8,&local_1330);
      std::__cxx11::string::~string((string *)&local_1330);
      std::__cxx11::string::~string((string *)&local_1308);
      std::allocator<char>::~allocator(&local_1309);
      std::__cxx11::string::~string((string *)&local_12e0);
      std::allocator<char>::~allocator(&local_12e1);
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar8,"this code should not be reached");
      __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_1130._M_current = end._M_current;
    ptVar1 = (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_int,_int>
              *)((long)&version_parser.f.
                        super_function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::unused_type_&>
                        .super_function_base.functor.members + 0x10);
    local_1138 = last;
    p_Var9 = std::get<0ul,std::__cxx11::string,bool,int,int>(ptVar1);
    p_Var10 = std::get<1ul,std::__cxx11::string,bool,int,int>(ptVar1);
    _Var2 = *p_Var10;
    p_Var11 = std::get<2ul,std::__cxx11::string,bool,int,int>(ptVar1);
    iVar3 = *p_Var11;
    p_Var12 = std::get<3ul,std::__cxx11::string,bool,int,int>(ptVar1);
    readGmshFileV2(&local_1128,local_1130,local_1138,p_Var9,(bool)(_Var2 & 1),iVar3,*p_Var12,
                   filename);
    std::variant<lf::io::GMshFileV2,lf::io::GMshFileV4>::
    variant<lf::io::GMshFileV2,void,void,lf::io::GMshFileV2,void>
              ((variant<lf::io::GMshFileV2,lf::io::GMshFileV4> *)__return_storage_ptr__,&local_1128)
    ;
    GMshFileV2::~GMshFileV2(&local_1128);
  }
  local_109c = 1;
  boost::spirit::qi::
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_int,_int>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::~rule((rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_int,_int>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
           *)local_ba8);
  boost::spirit::qi::
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::~rule((rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
           *)local_b20);
  std::
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_int,_int>
  ::~tuple((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_int,_int>
            *)((long)&version_parser.f.
                      super_function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::unused_type_&>
                      .super_function_base.functor + 0x10));
  std::__cxx11::string::~string((string *)local_a68);
  std::ifstream::~ifstream(&local_9e8);
  return __return_storage_ptr__;
}

Assistant:

std::variant<GMshFileV2, GMshFileV4> ReadGmshFile(const std::string& filename) {
  // Open file and copy it into memory:
  /////////////////////////////////////////////////////////////////////////////
  std::ifstream in(filename, std::ios_base::in | std::ios_base::binary);
  if (!in) {
    std::string error("Could not open file ");
    error += filename;
    throw lf::base::LfException(error);
  }

  std::string storage;
  in.unsetf(std::ios::skipws);  // no white space skipping
  std::copy(std::istream_iterator<char>(in), std::istream_iterator<char>(),
            std::back_inserter(storage));

  // Parse header to determine if we are dealing with ASCII format or binary
  // format + little or big endian:
  /////////////////////////////////////////////////////////////////////////////
  auto iter = storage.cbegin();
  auto end = storage.cend();

  namespace qi = boost::spirit::qi;
  namespace ascii = boost::spirit::ascii;

  // version, is_binary, sizeof(size_t), 1 (as int)
  std::tuple<std::string, bool, int, int> header;
  qi::rule<decltype(iter), std::string()> version_parser;

  version_parser %= +(ascii::alnum | ascii::punct);
  qi::rule<decltype(iter), decltype(header)(), ascii::space_type> header_parser;
  header_parser %= qi::lit("$MeshFormat") >>
                   (qi::hold[(version_parser >> qi::lit('0') >>
                              qi::attr(false) >> qi::int_ >> qi::attr(1))] |
                    (version_parser >> qi::lit('1') >> qi::attr(true) >>
                     qi::int_ >> qi::little_dword)) >>
                   qi::lit("$EndMeshFormat");

  bool succesful;
  succesful = qi::phrase_parse(iter, end, header_parser, ascii::space, header);

  LF_VERIFY_MSG(succesful, "Could not read header of file " << filename);

  if (std::get<0>(header) == "4.1") {
    return ReadGmshFileV4(iter, end, std::get<0>(header), std::get<1>(header),
                          std::get<2>(header), std::get<3>(header), filename);
  }
  if (std::get<0>(header) == "2.2") {
    return readGmshFileV2(iter, end, std::get<0>(header), std::get<1>(header),
                          std::get<2>(header), std::get<3>(header), filename);
  }
  LF_VERIFY_MSG(false, "GmshFiles with Version " << std::get<0>(header)
                                                 << " are not yet supported.");
}